

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O3

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeLinear>::Read(TPZCompElHDiv<pzshape::TPZShapeLinear> *this)

{
  void *in_RDX;
  TPZStream *in_RSI;
  
  Read((TPZCompElHDiv<pzshape::TPZShapeLinear> *)
       ((long)(this->fSideOrient).fExtAlloc +
       *(long *)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                           super_TPZInterpolatedElement.super_TPZInterpolationSpace.super_TPZCompEl
                + -0x48) + -0x68),in_RSI,in_RDX);
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::Read(TPZStream &buf, void *context)
{
	TPZInterpolatedElement::Read(buf,context);
  buf.Read(fConnectIndexes.begin(),TSHAPE::NSides);
	TPZManVector<int,3> order;
	buf.Read(order);
	this-> fIntRule.SetOrder(order);
    TPZManVector<int, TSHAPE::NFacets> SideOrient;
    buf.Read(SideOrient);
    fSideOrient = SideOrient;
	buf.Read(this->fConnectIndexes.begin(),TSHAPE::NSides);
	buf.Read(&this->fPreferredOrder,1);
    buf.Read(fSideOrient);
    int sz;
    buf.Read(&sz);
    for (int i=0; i<sz; i++) {
        TPZOneShapeRestraint one;
        one.Read(buf);
        fRestraints.push_back(one);
    }
	int classid = -1;
	buf.Read( &classid, 1 );
	if ( classid != this->ClassId())
	{
		std::stringstream sout;
		sout << "ERROR - " << __PRETTY_FUNCTION__
        << " trying to restore an object id " << this->ClassId() << " and classid read = " << classid;
		LOGPZ_ERROR ( logger, sout.str().c_str() );
	}
}